

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

OneofDescriptorProto * __thiscall
google::protobuf::DescriptorProto::add_oneof_decl(DescriptorProto *this)

{
  OneofDescriptorProto *pOVar1;
  OneofDescriptorProto *_add;
  DescriptorProto *this_local;
  
  pOVar1 = _internal_add_oneof_decl(this);
  return pOVar1;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::OneofDescriptorProto* DescriptorProto::add_oneof_decl() {
  ::PROTOBUF_NAMESPACE_ID::OneofDescriptorProto* _add = _internal_add_oneof_decl();
  // @@protoc_insertion_point(field_add:google.protobuf.DescriptorProto.oneof_decl)
  return _add;
}